

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::request_vote(raft_server *this,bool force_vote)

{
  atomic<int> *paVar1;
  __int_type_conflict _Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  srv_role sVar6;
  int32 iVar7;
  long *plVar8;
  element_type *peVar9;
  __int_type _Var10;
  _func_int **pp_Var11;
  element_type *peVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int32 iVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar17;
  undefined4 extraout_var_01;
  _func_int **pp_Var18;
  undefined4 extraout_var_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  msg_type type;
  undefined8 in_RDX;
  raft_server *this_01;
  _Hash_node_base *p_Var19;
  log_val_type local_da;
  undefined1 local_d9;
  string local_d8;
  ptr<peer> pp;
  ptr<log_entry> fv_msg_le;
  raft_server *local_88;
  ptr<req_msg> req;
  int local_6c;
  ptr<peer> local_68;
  rpc_handler *local_58;
  _func_int **local_50;
  _func_int **local_48;
  _func_int **local_40;
  _Hash_node_base *local_38;
  
  LOCK();
  paVar1 = &((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->voted_for_;
  _Var2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = this->id_;
  UNLOCK();
  plVar8 = *(long **)&(((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_).
                      super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar8 + 0x20))
            (plVar8,(this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,in_RDX,_Var2);
  uVar3 = this->votes_responded_;
  uVar4 = this->votes_granted_;
  this->votes_responded_ = uVar3 + 1;
  this->votes_granted_ = uVar4 + 1;
  peVar9 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = this;
  local_88 = this;
  if ((peVar9 != (element_type *)0x0) &&
     (iVar14 = (**(code **)(*(long *)peVar9 + 0x38))(), 3 < iVar14)) {
    peVar9 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = this->id_;
    sVar6 = (this->role_)._M_i;
    if (sVar6 == leader) {
      local_d8._M_string_length = 6;
      local_d8.field_2._M_allocated_capacity._0_7_ = 0x72656461656c;
    }
    else if (sVar6 == candidate) {
      local_d8.field_2._M_allocated_capacity = 0x74616469646e6163;
      local_d8.field_2._M_local_buf[8] = 'e';
      local_d8._M_string_length = 9;
      local_d8.field_2._M_local_buf[9] = '\0';
    }
    else if (sVar6 == follower) {
      local_d8.field_2._M_allocated_capacity = 0x7265776f6c6c6f66;
      local_d8._M_string_length = 8;
      local_d8.field_2._M_local_buf[8] = '\0';
    }
    else {
      local_d8.field_2._M_allocated_capacity = 0x4e574f4e4b4e55;
      local_d8._M_string_length = 7;
    }
    _Var10 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    iVar14 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    iVar15 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    uVar17 = term_for_log(this,CONCAT44(extraout_var_00,iVar15) - 1);
    this_01 = local_88;
    msg_if_given_abi_cxx11_
              ((string *)&fv_msg_le,
               "[VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
               ,(ulong)uVar5,&local_d8.field_2,_Var10,CONCAT44(extraout_var,iVar14) + -1,uVar17,
               (ulong)(uint)local_88->target_priority_,(ulong)(uint)this->my_priority_);
    (**(code **)(*(long *)peVar9 + 0x40))
              (peVar9,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"request_vote",0xe9,&fv_msg_le);
    if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)&stack0xffffffffffffff68) {
      operator_delete(fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  iVar14 = this_01->votes_granted_;
  iVar16 = get_quorum_for_election(this_01);
  if (iVar16 < iVar14) {
    this_01->election_completed_ = true;
    become_leader(this_01);
  }
  else {
    p_Var19 = (this_01->peers_)._M_h._M_before_begin._M_nxt;
    if (p_Var19 != (_Hash_node_base *)0x0) {
      local_58 = &this_01->resp_handler_;
      local_40 = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bd0a0;
      local_48 = (_func_int **)&PTR__req_msg_005bd0f0;
      local_50 = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bd400;
      do {
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var19[2]._M_nxt;
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[3]._M_nxt;
        if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar13 = is_regular_member(this_01,&pp);
        if (bVar13) {
          _Var10 = (((this_01->state_).
                     super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   term_).super___atomic_base<unsigned_long>._M_i;
          iVar16 = (((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->id_;
          iVar14 = (*((this_01->log_store_).
                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_log_store[2])();
          pp_Var18 = (_func_int **)term_for_log(this_01,CONCAT44(extraout_var_01,iVar14) - 1);
          local_38 = p_Var19;
          iVar14 = (*((this_01->log_store_).
                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_log_store[2])();
          pp_Var11 = (_func_int **)
                     (this_01->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          p_Var19 = local_38;
          (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = 1;
          (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = 1;
          (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base = local_40;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1);
          iVar7 = this_01->id_;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_use_count = (int)_Var10;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_weak_count = (int)(_Var10 >> 0x20);
          *(undefined4 *)
           &req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
            ._vptr__Sp_counted_base = 1;
          *(int32 *)((long)&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = iVar7;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_use_count = iVar16;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _vptr__Sp_counted_base = local_48;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
          _vptr__Sp_counted_base = pp_Var18;
          *(long *)&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi[3]._M_use_count = CONCAT44(extraout_var_02,iVar14) + -1;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
          _vptr__Sp_counted_base = pp_Var11;
          *(undefined1 (*) [16])
           &req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4]
            ._M_use_count = (undefined1  [16])0x0;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
          _M_use_count = 0;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
          _M_weak_count = 0;
          if (force_vote) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
            this_00->_M_use_count = 1;
            this_00->_M_weak_count = 1;
            this_00->_vptr__Sp_counted_base = local_50;
            local_6c = 0;
            force_vote_msg::serialize((force_vote_msg *)&local_d8);
            local_da = custom;
            fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                      (&fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(log_entry **)&fv_msg_le,
                       (allocator<nuraft::log_entry> *)&local_d9,&local_6c,
                       (shared_ptr<nuraft::buffer> *)&local_d8,&local_da);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
            }
            std::
            vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->log_entries_,(value_type *)&fv_msg_le);
            if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          this_01 = local_88;
          peVar9 = (local_88->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if ((peVar9 != (element_type *)0x0) &&
             (iVar14 = (**(code **)(*(long *)peVar9 + 0x38))(), 4 < iVar14)) {
            peVar9 = (this_01->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_type_to_string_abi_cxx11_
                      (&local_d8,
                       (nuraft *)
                       (ulong)((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_msg_base).type_,type);
            msg_if_given_abi_cxx11_
                      ((string *)&fv_msg_le,"send %s to server %d with term %lu",
                       local_d8._M_dataplus._M_p,
                       (ulong)*(uint *)&(p_Var19[2]._M_nxt)->_M_nxt->_M_nxt,
                       (((this_01->state_).
                         super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       term_).super___atomic_base<unsigned_long>._M_i);
            (**(code **)(*(long *)peVar9 + 0x40))
                      (peVar9,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_vote",0x10e,(string *)&fv_msg_le);
            if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)&stack0xffffffffffffff68) {
              operator_delete(fv_msg_le.
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
          }
          LOCK();
          bVar13 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   busy_flag_)._M_base._M_i == false;
          if (bVar13) {
            ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->busy_flag_).
            _M_base._M_i = true;
          }
          UNLOCK();
          if (bVar13) {
            local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ;
            if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_M_use_count =
                     (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_M_use_count =
                     (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
              }
            }
            peer::send_req(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &local_68,&req,local_58);
            if (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          else {
            peVar9 = (this_01->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar9 != (element_type *)0x0) &&
               (iVar14 = (**(code **)(*(long *)peVar9 + 0x38))(), 2 < iVar14)) {
              peVar9 = (this_01->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              peVar12 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&fv_msg_le,"failed to send vote request: peer %d (%s) is busy",
                         (ulong)(uint)peVar12->id_,(peVar12->endpoint_)._M_dataplus._M_p);
              (**(code **)(*(long *)peVar9 + 0x40))
                        (peVar9,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_vote",0x113,(string *)&fv_msg_le);
              if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)&stack0xffffffffffffff68) {
                operator_delete(fv_msg_le.
                                super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
              }
            }
          }
          if (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        p_Var19 = p_Var19->_M_nxt;
      } while (p_Var19 != (_Hash_node_base *)0x0);
    }
  }
  return;
}

Assistant:

void raft_server::request_vote(bool force_vote) {
    state_->set_voted_for(id_);
    ctx_->state_mgr_->save_state(*state_);
    votes_granted_ += 1;
    votes_responded_ += 1;
    p_in("[VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    // is this the only server?
    if (votes_granted_ > get_quorum_for_election()) {
        election_completed_ = true;
        become_leader();
        return;
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }
        ptr<req_msg> req = cs_new<req_msg>
                           ( state_->get_term(),
                             msg_type::request_vote_request,
                             id_,
                             pp->get_id(),
                             term_for_log(log_store_->next_slot() - 1),
                             log_store_->next_slot() - 1,
                             quick_commit_index_.load() );
        if (force_vote) {
            // Add a special log entry to let receivers ignore the priority.

            // Force vote message, and wrap it using log_entry.
            ptr<force_vote_msg> fv_msg = cs_new<force_vote_msg>();
            ptr<log_entry> fv_msg_le =
                cs_new<log_entry>(0, fv_msg->serialize(), log_val_type::custom);

            // Ship it.
            req->log_entries().push_back(fv_msg_le);
        }
        p_db( "send %s to server %d with term %" PRIu64 "",
              msg_type_to_string(req->get_type()).c_str(),
              it->second->get_id(),
              state_->get_term() );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send vote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}